

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_32x64_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  int in_R9D;
  uint16_t dstT [2048];
  int in_stack_ffffffffffffefe0;
  int in_stack_ffffffffffffefe4;
  ptrdiff_t in_stack_ffffffffffffefe8;
  uint16_t *in_stack_ffffffffffffeff0;
  ptrdiff_t in_stack_ffffffffffffeff8;
  uint16_t *in_stack_fffffffffffff000;
  int in_stack_fffffffffffff208;
  int in_stack_fffffffffffff20c;
  uint16_t *in_stack_fffffffffffff210;
  ptrdiff_t in_stack_fffffffffffff218;
  uint16_t *in_stack_fffffffffffff220;
  int in_stack_fffffffffffff22c;
  int in_stack_fffffffffffff2a8;
  int in_stack_fffffffffffff2ac;
  uint16_t *in_stack_fffffffffffff2b0;
  ptrdiff_t in_stack_fffffffffffff2b8;
  uint16_t *in_stack_fffffffffffff2c0;
  int in_stack_fffffffffffff2c8;
  
  if (in_R9D < 0xc) {
    highbd_dr_prediction_z1_64xN_avx2
              (in_stack_fffffffffffff22c,in_stack_fffffffffffff220,in_stack_fffffffffffff218,
               in_stack_fffffffffffff210,in_stack_fffffffffffff20c,in_stack_fffffffffffff208);
  }
  else {
    highbd_dr_prediction_32bit_z1_64xN_avx2
              (in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8,
               in_stack_fffffffffffff2b0,in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8);
  }
  highbd_transpose(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
                   in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0);
  return;
}

Assistant:

static void highbd_dr_prediction_z3_32x64_avx2(uint16_t *dst, ptrdiff_t stride,
                                               const uint16_t *left,
                                               int upsample_left, int dy,
                                               int bd) {
  uint16_t dstT[64 * 32];
  if (bd < 12) {
    highbd_dr_prediction_z1_64xN_avx2(32, dstT, 64, left, upsample_left, dy);
  } else {
    highbd_dr_prediction_32bit_z1_64xN_avx2(32, dstT, 64, left, upsample_left,
                                            dy);
  }
  highbd_transpose(dstT, 64, dst, stride, 32, 64);
}